

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<unsigned_int> __thiscall wasm::WATParser::Lexer::takeI<unsigned_int>(Lexer *this)

{
  bool bVar1;
  LexIntResult *pLVar2;
  size_type sVar3;
  uint local_54;
  string_view local_50;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = this;
  local_50 = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,local_50);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    bVar1 = anon_unknown_0::LexIntResult::isUnsigned<unsigned_int>(pLVar2);
    if (!bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40
                         );
      bVar1 = anon_unknown_0::LexIntResult::isSigned<int>(pLVar2);
      if (!bVar1) goto LAB_023223de;
    }
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
    this->pos = sVar3 + this->pos;
    advance(this);
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    local_54 = (uint)pLVar2->n;
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)&this_local,&local_54);
  }
  else {
LAB_023223de:
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<T> Lexer::takeI() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next())) {
    if (result->isUnsigned<T>() || result->isSigned<std::make_signed_t<T>>()) {
      pos += result->span.size();
      advance();
      return T(result->n);
    }
  }
  return std::nullopt;
}